

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O2

Abc_Des_t * Abc_DesDup(Abc_Des_t *p)

{
  Abc_Des_t *p_00;
  Abc_Ntk_t *pAVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  Vec_Ptr_t *p_01;
  int iVar7;
  
  p_00 = Abc_DesCreate(p->pName);
  for (iVar6 = 0; iVar6 < p->vModules->nSize; iVar6 = iVar6 + 1) {
    pAVar1 = (Abc_Ntk_t *)Vec_PtrEntry(p->vModules,iVar6);
    pAVar1 = Abc_NtkDup(pAVar1);
    Abc_DesAddModel(p_00,pAVar1);
  }
  for (iVar6 = 0; iVar6 < p->vTops->nSize; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(p->vTops,iVar6);
    Vec_PtrPush(p_00->vTops,*(void **)((long)pvVar2 + 0x160));
  }
  iVar6 = 0;
  while( true ) {
    p_01 = p->vModules;
    iVar7 = p_01->nSize;
    if (iVar7 <= iVar6) break;
    pvVar2 = Vec_PtrEntry(p_01,iVar6);
    if (*(long *)((long)pvVar2 + 0xb8) == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(undefined8 *)(*(long *)((long)pvVar2 + 0xb8) + 0x160);
    }
    *(undefined8 *)(*(long *)((long)pvVar2 + 0x160) + 0xb8) = uVar5;
    iVar6 = iVar6 + 1;
  }
  iVar6 = 0;
  do {
    if (iVar7 <= iVar6) {
      return p_00;
    }
    pAVar1 = (Abc_Ntk_t *)Vec_PtrEntry(p_01,iVar6);
    for (iVar7 = 0; iVar7 < pAVar1->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar3 = Abc_NtkBox(pAVar1,iVar7);
      uVar4 = *(uint *)&pAVar3->field_0x14 & 0xf;
      if (uVar4 == 9) {
        ((pAVar3->field_6).pCopy)->field_5 =
             *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)((long)(pAVar3->field_5).pData + 0x160);
      }
      else if (uVar4 == 10) {
        __assert_fail("pObj->Type == ABC_OBJ_WHITEBOX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x151,"Abc_Ntk_t *Abc_ObjModel(Abc_Obj_t *)");
      }
    }
    iVar6 = iVar6 + 1;
    p_01 = p->vModules;
    iVar7 = p_01->nSize;
  } while( true );
}

Assistant:

Abc_Des_t * Abc_DesDup( Abc_Des_t * p )
{
    Abc_Des_t * pNew;
    Abc_Ntk_t * pTemp;
    Abc_Obj_t * pObj;
    int i, k;
    pNew = Abc_DesCreate( p->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        Abc_DesAddModel( pNew, Abc_NtkDup(pTemp) );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vTops, pTemp, i )
        Vec_PtrPush( pNew->vTops, pTemp->pCopy );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        pTemp->pCopy->pAltView = pTemp->pAltView ? pTemp->pAltView->pCopy : NULL;
    // update box models
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pObj, k )
            if ( Abc_ObjIsWhitebox(pObj) || Abc_ObjIsBlackbox(pObj) )
                pObj->pCopy->pData = Abc_ObjModel(pObj)->pCopy;
    return pNew;
}